

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O1

void __thiscall iDynTree::AttitudeQuaternionEKF::ekfComputeJacobianH(AttitudeQuaternionEKF *this)

{
  MatrixDynSize *in_RDX;
  VectorDynSize *in_RSI;
  
  ekfComputeJacobianH((AttitudeQuaternionEKF *)
                      (this[-1].m_gravity_direction.super_Vector3.m_data + 2),in_RSI,in_RDX);
  return;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::ekfComputeJacobianH(iDynTree::VectorDynSize& x, iDynTree::MatrixDynSize& H)
{
    using iDynTree::toEigen;

    if (x.size() != m_state_size)
    {
        reportError("AttitudeQuaternionEKF", "computejacobianH", "state size mismatch");
        return false;
    }

    if (H.rows() != m_output_size || H.cols() != m_state_size)
    {
        reportError("AttitudeQuaternionEKF", "computejacobianH", "jacobian matrix size mismatch");
        return false;
    }

    H.zero();
    iDynTree::UnitQuaternion q;
    toEigen(q) = toEigen(x).block<4,1>(0, 0);

    iDynTree::MatrixDynSize dhacc_by_dq;
    dhacc_by_dq.resize(3, 4);
    dhacc_by_dq(0, 0) = dhacc_by_dq(2, 2) = q(2);
    dhacc_by_dq(0, 1) = dhacc_by_dq(1, 2) = -q(3);
    dhacc_by_dq(0, 3) = dhacc_by_dq(1, 0) = -q(1);
    dhacc_by_dq(1, 1) = dhacc_by_dq(2, 0) = -q(0);
    dhacc_by_dq(0, 2) = q(0);
    dhacc_by_dq(1, 3) = -q(2);
    dhacc_by_dq(2, 1) = q(1);
    dhacc_by_dq(2, 3) = -q(3);

    if (m_gravity_direction(2) == -1)
    {
        toEigen(dhacc_by_dq) *= 2;
    }
    else if (m_gravity_direction(2) == 1)
    {
        toEigen(dhacc_by_dq) *= -2;
    }
    else
    {
        reportError("AttitudeQuaternionEKF", "computejacobianH", "filter assumes gravity pointing upward or downward only");
        return false;
    }

    toEigen(H).block<3, 4>(0, 0) = toEigen(dhacc_by_dq);

    if (m_output_size == output_dimensions_with_magnetometer)
    {
        double q0q3{q(0)*q(3)};
        double q1q2{q(1)*q(2)};
        double q2squared{q(2)*q(2)};
        double q3squared{q(3)*q(3)};
        double common_factor{(1 - 2*(q2squared + q3squared))};
        double common_factorSquared{common_factor*common_factor};
        double q0q3plusq1q2Squared{((q0q3+q1q2)*(q0q3+q1q2))};
        double denominator{(4*q0q3plusq1q2Squared) + (common_factorSquared)};

        double multiple{(2*common_factor/denominator)};
        double factor{(-8*(q0q3 + q1q2))/denominator};

        H(3, 0) = q(3)*multiple;
        H(3, 1) = q(2)*multiple;
        H(3, 1) = (q(1)*multiple) - (q(2)*factor);
        H(3, 2) = (q(0)*multiple) - (q(3)*factor);
    }

    return true;
}